

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
* cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::find_word_endings
            (vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
             *__return_storage_ptr__,Iterator first,Iterator last)

{
  char32_t cVar1;
  iterator iVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  undefined8 uVar6;
  bool bVar7;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> local_50;
  vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
  *local_48;
  uint local_3c;
  char32_t *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (first._M_current != last._M_current) {
    uVar5 = 0;
    local_48 = (vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
                *)__return_storage_ptr__;
    local_38 = last._M_current;
    bVar7 = false;
    do {
      cVar1 = *first._M_current;
      cVar4 = u_hasBinaryProperty_70(cVar1,0x1e);
      uVar6 = u_hasBinaryProperty_70(cVar1,0x2c);
      cVar3 = (char)uVar6;
      local_3c = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),cVar3 != '\0');
      if (((uVar5 & 1) != 0) && (!(bool)((bVar7 | cVar4 == '\0') & cVar3 != '\0'))) {
        local_50._M_current = first._M_current + -1;
        iVar2._M_current =
             *(__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
               **)(local_48 + 8);
        if (iVar2._M_current ==
            *(__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
              **)(local_48 + 0x10)) {
          std::
          vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>
                    (local_48,iVar2,&local_50);
        }
        else {
          (iVar2._M_current)->_M_current = local_50._M_current;
          *(long *)(local_48 + 8) = *(long *)(local_48 + 8) + 8;
        }
      }
      __return_storage_ptr__ =
           (vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
            *)local_48;
      first._M_current = first._M_current + 1;
      uVar5 = local_3c;
      bVar7 = cVar4 != '\0';
    } while (first._M_current != local_38);
    if (cVar3 != '\0') {
      local_50._M_current = local_38 + -1;
      iVar2._M_current =
           *(__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
             **)(local_48 + 8);
      if (iVar2._M_current ==
          *(__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
            **)(local_48 + 0x10)) {
        std::
        vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
        ::
        _M_realloc_insert<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>
                  (local_48,iVar2,&local_50);
      }
      else {
        (iVar2._M_current)->_M_current = local_50._M_current;
        *(long *)(local_48 + 8) = *(long *)(local_48 + 8) + 8;
      }
    }
  }
  return (vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
          *)(vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,std::allocator<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>>>
             *)__return_storage_ptr__;
}

Assistant:

static std::vector<Iterator> find_word_endings(Iterator const first,
                                                 Iterator const last) {
    std::vector<Iterator> word_ends;
    bool prev_uppercase = false;
    bool prev_alphanumeric = false;
    for (auto it = first; it != last; ++it) {
      auto const c = *it;
      bool const next_uppercase = StringTraits::is_uppercase(c);
      bool const next_alphanumeric = StringTraits::is_alphanumeric(c);
      if (prev_alphanumeric &&
          (!next_alphanumeric || (!prev_uppercase && next_uppercase))) {
        word_ends.push_back(it - 1);
      }
      prev_uppercase = next_uppercase;
      prev_alphanumeric = next_alphanumeric;
    }
    if (prev_alphanumeric) {
      word_ends.push_back(last - 1);
    }
    return word_ends;
  }